

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_act.c
# Opt level: O1

bool redit_oshow(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  OBJ_INDEX_DATA *pOVar2;
  char *pcVar3;
  
  if (*argument == '\0') {
    pcVar3 = "Syntax:  oshow <vnum>\n\r";
  }
  else {
    pcVar3 = argument;
    bVar1 = is_number(argument);
    if (bVar1) {
      bVar1 = is_number(argument);
      if (bVar1) {
        atoi(argument);
        pOVar2 = get_obj_index(0);
        if (pOVar2 == (OBJ_INDEX_DATA *)0x0) {
          pcVar3 = "REdit:  That object does not exist.\n\r";
          goto LAB_0035e298;
        }
        ch->desc->pEdit = pOVar2;
      }
      oedit_show(ch,pcVar3);
      ch->desc->pEdit = ch->in_room;
      return false;
    }
    pcVar3 = "REdit: vnum has to be a number.\n\r";
  }
LAB_0035e298:
  send_to_char(pcVar3,ch);
  return false;
}

Assistant:

bool redit_oshow(CHAR_DATA *ch, char *argument)
{
	OBJ_INDEX_DATA *pObj;
	int value;

	if (argument[0] == '\0')
	{
		send_to_char("Syntax:  oshow <vnum>\n\r", ch);
		return false;
	}

	if (!is_number(argument))
	{
		send_to_char("REdit: vnum has to be a number.\n\r", ch);
		return false;
	}

	if (is_number(argument))
	{
		value = atoi(argument);
		pObj = get_obj_index(value);
		if (!(pObj))
		{
			send_to_char("REdit:  That object does not exist.\n\r", ch);
			return false;
		}

		ch->desc->pEdit = (void *)pObj;
	}

	oedit_show(ch, argument);
	ch->desc->pEdit = (void *)ch->in_room;
	return false;
}